

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,FixedArray<char,_1UL> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,
          ArrayPtr<const_char> *params_5,ArrayPtr<const_char> *params_6,
          ArrayPtr<const_char> *params_7,CappedArray<char,_14UL> *params_8,
          ArrayPtr<const_char> *params_9)

{
  size_t sVar1;
  ArrayPtr<const_char> *pAVar2;
  FixedArray<char,_1UL> *pFVar3;
  CappedArray<char,_14UL> *pCVar4;
  char *pos;
  ArrayPtr<const_char> *rest;
  ArrayPtr<const_char> *rest_2;
  ArrayPtr<const_char> *rest_3;
  ArrayPtr<const_char> *rest_4;
  ArrayPtr<const_char> *rest_5;
  ArrayPtr<const_char> *rest_6;
  ArrayPtr<const_char> *rest_8;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  size_t local_1c0;
  size_t local_1b8;
  size_t local_1b0;
  size_t local_1a8;
  size_t local_1a0;
  size_t local_198;
  size_t local_190;
  size_t local_188;
  size_t local_180;
  size_t local_178;
  _ *local_170;
  undefined8 local_168;
  Array<kj::StringTree::Branch> local_160;
  size_t local_138;
  size_t local_130;
  size_t local_128;
  size_t local_120;
  size_t local_118;
  size_t local_110;
  size_t local_108;
  size_t local_100;
  size_t local_f8;
  size_t local_f0;
  _ *local_e8;
  undefined8 local_e0;
  String local_d8;
  size_t local_c0;
  size_t local_b8;
  size_t local_b0;
  size_t local_a8;
  size_t local_a0;
  size_t local_98;
  size_t local_90;
  size_t local_88;
  size_t local_80;
  size_t local_78;
  _ *local_70;
  undefined8 local_68;
  undefined1 local_59;
  ArrayPtr<const_char> *local_58;
  ArrayPtr<const_char> *params_local_4;
  ArrayPtr<const_char> *params_local_3;
  FixedArray<char,_1UL> *params_local_2;
  ArrayPtr<const_char> *params_local_1;
  ArrayPtr<const_char> *params_local;
  StringTree *result;
  
  local_59 = 0;
  local_58 = params_3;
  params_local_4 = (ArrayPtr<const_char> *)params_2;
  params_local_3 = params_1;
  params_local_2 = (FixedArray<char,_1UL> *)params;
  params_local_1 = (ArrayPtr<const_char> *)this;
  params_local = (ArrayPtr<const_char> *)__return_storage_ptr__;
  StringTree(__return_storage_ptr__);
  local_c0 = ArrayPtr<const_char>::size(params_local_1);
  local_b8 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_local_2);
  local_b0 = FixedArray<char,_1UL>::size((FixedArray<char,_1UL> *)params_local_3);
  local_a8 = ArrayPtr<const_char>::size(params_local_4);
  local_a0 = ArrayPtr<const_char>::size(local_58);
  local_98 = ArrayPtr<const_char>::size(params_4);
  local_90 = ArrayPtr<const_char>::size(params_5);
  local_88 = ArrayPtr<const_char>::size(params_6);
  local_80 = CappedArray<char,_14UL>::size((CappedArray<char,_14UL> *)params_7);
  local_78 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_8);
  local_70 = (_ *)&local_c0;
  local_68 = 10;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0xa;
  sVar1 = _::sum(local_70,nums);
  __return_storage_ptr__->size_ = sVar1;
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_1);
  local_138 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_2);
  local_130 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pFVar3 = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)params_local_3);
  local_128 = flatSize<kj::FixedArray<char,1ul>>(pFVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_4);
  local_120 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(local_58);
  local_118 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_4);
  local_110 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_5);
  local_108 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_6);
  local_100 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_7);
  local_f8 = flatSize<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_8);
  local_f0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  local_e8 = (_ *)&local_138;
  local_e0 = 10;
  nums_00._M_len = extraout_RDX_00;
  nums_00._M_array = (iterator)0xa;
  sVar1 = _::sum(local_e8,nums_00);
  heapString(&local_d8,sVar1);
  String::operator=(&__return_storage_ptr__->text,&local_d8);
  String::~String(&local_d8);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_1);
  local_1c0 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_2);
  local_1b8 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pFVar3 = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)params_local_3);
  local_1b0 = branchCount<kj::FixedArray<char,1ul>>(pFVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_4);
  local_1a8 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(local_58);
  local_1a0 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_4);
  local_198 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_5);
  local_190 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_6);
  local_188 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_7);
  local_180 = branchCount<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_8);
  local_178 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  local_170 = (_ *)&local_1c0;
  local_168 = 10;
  nums_01._M_len = extraout_RDX_01;
  nums_01._M_array = (iterator)0xa;
  sVar1 = _::sum(local_170,nums_01);
  heapArray<kj::StringTree::Branch>(&local_160,sVar1);
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_160);
  Array<kj::StringTree::Branch>::~Array(&local_160);
  pos = String::begin(&__return_storage_ptr__->text);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_1);
  rest = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_2);
  pFVar3 = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)params_local_3);
  rest_2 = fwd<kj::ArrayPtr<char_const>>(params_local_4);
  rest_3 = fwd<kj::ArrayPtr<char_const>>(local_58);
  rest_4 = fwd<kj::ArrayPtr<char_const>>(params_4);
  rest_5 = fwd<kj::ArrayPtr<char_const>>(params_5);
  rest_6 = fwd<kj::ArrayPtr<char_const>>(params_6);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_7);
  rest_8 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_8);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,pAVar2,rest,pFVar3,rest_2,rest_3,rest_4,rest_5,rest_6,
             pCVar4,rest_8);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}